

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

void dlep_session_remove(dlep_session *session)

{
  oonf_log_source oVar1;
  char *pcVar2;
  list_entity *plVar3;
  undefined8 uVar4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  netaddr_str nbuf;
  dlep_session_parser *parser;
  dlep_parser_tlv *tlv_it;
  dlep_parser_tlv *tlv;
  dlep_session *session_local;
  
  if (((&log_global_mask)[session->log_source] & 1) != 0) {
    oVar1 = session->log_source;
    pcVar2 = (session->l2_listener).name;
    uVar4 = netaddr_socket_to_string((long)&__tempptr + 2,&session->remote_socket);
    oonf_log(1,oVar1,"src/generic/dlep/dlep_session.c",0xbe,0,0,"Remove session if %s to %s",pcVar2,
             uVar4);
  }
  os_interface_linux_remove(&session->l2_listener);
  nbuf.buf._54_8_ = &session->parser;
  plVar3 = (((dlep_session_parser *)nbuf.buf._54_8_)->allowed_tlvs).list_head.next;
  tlv_it = (dlep_parser_tlv *)&plVar3[-2].prev;
  plVar3 = plVar3->next;
  while( true ) {
    parser = (dlep_session_parser *)&plVar3[-2].prev;
    if ((tlv_it->_node).list.prev == *(list_entity **)(nbuf.buf._54_8_ + 8)) break;
    avl_remove(nbuf.buf._54_8_,&tlv_it->_node);
    oonf_class_free(&_tlv_class,tlv_it);
    tlv_it = (dlep_parser_tlv *)parser;
    plVar3 = plVar3->next;
  }
  oonf_timer_stop(&session->local_event_timer);
  oonf_timer_stop(&session->remote_heartbeat_timeout);
  *(undefined8 *)(nbuf.buf._54_8_ + 0x70) = 0;
  free(*(void **)(nbuf.buf._54_8_ + 0x28));
  *(undefined8 *)(nbuf.buf._54_8_ + 0x28) = 0;
  session->_peer_state = DLEP_PEER_NOT_CONNECTED;
  return;
}

Assistant:

void
dlep_session_remove(struct dlep_session *session) {
  struct dlep_parser_tlv *tlv, *tlv_it;
  struct dlep_session_parser *parser;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  OONF_DEBUG(session->log_source, "Remove session if %s to %s", session->l2_listener.name,
    netaddr_socket_to_string(&nbuf, &session->remote_socket));

  os_interface_remove(&session->l2_listener);

  parser = &session->parser;
  avl_for_each_element_safe(&parser->allowed_tlvs, tlv, _node, tlv_it) {
    avl_remove(&parser->allowed_tlvs, &tlv->_node);
    oonf_class_free(&_tlv_class, tlv);
  }

  oonf_timer_stop(&session->local_event_timer);
  oonf_timer_stop(&session->remote_heartbeat_timeout);

  parser->extension_count = 0;

  free(parser->values);
  parser->values = NULL;

  session->_peer_state = DLEP_PEER_NOT_CONNECTED;
}